

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall QMainWindowLayoutState::deleteCentralWidgetItem(QMainWindowLayoutState *this)

{
  QLayoutItem *pQVar1;
  
  pQVar1 = (this->dockAreaLayout).centralWidgetItem;
  if (pQVar1 != (QLayoutItem *)0x0) {
    (*pQVar1->_vptr_QLayoutItem[1])();
  }
  (this->dockAreaLayout).centralWidgetItem = (QLayoutItem *)0x0;
  return;
}

Assistant:

void QMainWindowLayoutState::deleteCentralWidgetItem()
{
#if QT_CONFIG(dockwidget)
    delete dockAreaLayout.centralWidgetItem;
    dockAreaLayout.centralWidgetItem = nullptr;
#else
    delete centralWidgetItem;
    centralWidgetItem = 0;
#endif
}